

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void fill_inverse_cmap(j_decompress_ptr cinfo,int c0,int c1,int c2)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  JSAMPLE bestcolor [128];
  int numcolors;
  JSAMPLE colorlist [256];
  histptr cachep;
  JSAMPLE *cptr;
  int ic2;
  int ic1;
  int ic0;
  int minc2;
  int minc1;
  int minc0;
  hist3d histogram;
  my_cquantize_ptr_conflict cquantize;
  JSAMPLE *in_stack_000001f8;
  int in_stack_00000200;
  int in_stack_00000204;
  int in_stack_00000208;
  int in_stack_0000020c;
  j_decompress_ptr in_stack_00000210;
  JSAMPLE *in_stack_00000220;
  JSAMPLE *in_stack_000005c8;
  int in_stack_000005d4;
  int in_stack_000005d8;
  int in_stack_000005dc;
  j_decompress_ptr in_stack_000005e0;
  byte local_1e8 [140];
  int local_15c;
  short *local_50;
  byte *local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  long local_20;
  int local_14;
  int local_10;
  int local_c;
  
  local_20 = *(long *)(in_RDI + 0x270);
  local_28 = *(long *)(local_20 + 0x30);
  local_c = in_ESI >> 2;
  local_10 = in_EDX >> 3;
  local_14 = in_ECX >> 2;
  local_2c = local_c * 0x20 + 4;
  local_30 = local_10 * 0x20 + 2;
  local_34 = local_14 * 0x20 + 4;
  local_15c = find_nearby_colors(in_stack_000005e0,in_stack_000005dc,in_stack_000005d8,
                                 in_stack_000005d4,in_stack_000005c8);
  find_best_colors(in_stack_00000210,in_stack_0000020c,in_stack_00000208,in_stack_00000204,
                   in_stack_00000200,in_stack_000001f8,in_stack_00000220);
  local_48 = local_1e8;
  for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
      local_50 = (short *)(*(long *)(local_28 + (long)(local_c * 4 + local_38) * 8) +
                           (long)(local_10 * 8 + local_3c) * 0x40 + (long)(local_14 << 2) * 2);
      for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
        *local_50 = *local_48 + 1;
        local_50 = local_50 + 1;
        local_48 = local_48 + 1;
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
fill_inverse_cmap(j_decompress_ptr cinfo, int c0, int c1, int c2)
/* Fill the inverse-colormap entries in the update box that contains */
/* histogram cell c0/c1/c2.  (Only that one cell MUST be filled, but */
/* we can fill as many others as we wish.) */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  int minc0, minc1, minc2;      /* lower left corner of update box */
  int ic0, ic1, ic2;
  register JSAMPLE *cptr;       /* pointer into bestcolor[] array */
  register histptr cachep;      /* pointer into main cache array */
  /* This array lists the candidate colormap indexes. */
  JSAMPLE colorlist[MAXNUMCOLORS];
  int numcolors;                /* number of candidate colors */
  /* This array holds the actually closest colormap index for each cell. */
  JSAMPLE bestcolor[BOX_C0_ELEMS * BOX_C1_ELEMS * BOX_C2_ELEMS];

  /* Convert cell coordinates to update box ID */
  c0 >>= BOX_C0_LOG;
  c1 >>= BOX_C1_LOG;
  c2 >>= BOX_C2_LOG;

  /* Compute true coordinates of update box's origin corner.
   * Actually we compute the coordinates of the center of the corner
   * histogram cell, which are the lower bounds of the volume we care about.
   */
  minc0 = (c0 << BOX_C0_SHIFT) + ((1 << C0_SHIFT) >> 1);
  minc1 = (c1 << BOX_C1_SHIFT) + ((1 << C1_SHIFT) >> 1);
  minc2 = (c2 << BOX_C2_SHIFT) + ((1 << C2_SHIFT) >> 1);

  /* Determine which colormap entries are close enough to be candidates
   * for the nearest entry to some cell in the update box.
   */
  numcolors = find_nearby_colors(cinfo, minc0, minc1, minc2, colorlist);

  /* Determine the actually nearest colors. */
  find_best_colors(cinfo, minc0, minc1, minc2, numcolors, colorlist,
                   bestcolor);

  /* Save the best color numbers (plus 1) in the main cache array */
  c0 <<= BOX_C0_LOG;            /* convert ID back to base cell indexes */
  c1 <<= BOX_C1_LOG;
  c2 <<= BOX_C2_LOG;
  cptr = bestcolor;
  for (ic0 = 0; ic0 < BOX_C0_ELEMS; ic0++) {
    for (ic1 = 0; ic1 < BOX_C1_ELEMS; ic1++) {
      cachep = &histogram[c0 + ic0][c1 + ic1][c2];
      for (ic2 = 0; ic2 < BOX_C2_ELEMS; ic2++) {
        *cachep++ = (histcell)((*cptr++) + 1);
      }
    }
  }
}